

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QString * __thiscall
QAccessibleTableCell::text(QString *__return_storage_ptr__,QAccessibleTableCell *this,Text t)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  char cVar3;
  QAbstractItemModel *pQVar4;
  QArrayData *pQVar5;
  longlong __tmp;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  cVar3 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar3 == '\0') goto LAB_00536233;
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)(this->view).wp.value);
  if (t == Description) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar4 + 0x90))(&local_58,pQVar4,&local_90,0xc);
    ::QVariant::toString();
    pQVar5 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_78;
    (__return_storage_ptr__->d).ptr = pcStack_70;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_68;
    pcStack_70 = pcVar1;
    local_68 = qVar2;
  }
  else {
    if (t != Name) goto LAB_00536233;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar4 + 0x90))(&local_58,pQVar4,&local_90,0xb);
    ::QVariant::toString();
    pQVar5 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_78;
    (__return_storage_ptr__->d).ptr = pcStack_70;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_68;
    local_78 = pQVar5;
    pcStack_70 = pcVar1;
    local_68 = qVar2;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    ::QVariant::~QVariant(&local_58);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_00536233;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar4 + 0x90))(&local_58,pQVar4,&local_90,0);
    ::QVariant::toString();
    pQVar5 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_78;
    (__return_storage_ptr__->d).ptr = pcStack_70;
    (__return_storage_ptr__->d).size = local_68;
    pcStack_70 = pcVar1;
    local_68 = 0;
  }
  local_78 = pQVar5;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  ::QVariant::~QVariant(&local_58);
LAB_00536233:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTableCell::text(QAccessible::Text t) const
{
    QString value;
    if (!isValid())
        return value;
    QAbstractItemModel *model = view->model();
    switch (t) {
    case QAccessible::Name:
        value = model->data(m_index, Qt::AccessibleTextRole).toString();
        if (value.isEmpty())
            value = model->data(m_index, Qt::DisplayRole).toString();
        break;
    case QAccessible::Description:
        value = model->data(m_index, Qt::AccessibleDescriptionRole).toString();
        break;
    default:
        break;
    }
    return value;
}